

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  bool bVar1;
  slot_type *new_slot;
  ctrl_t *pcVar2;
  slot_type *from;
  size_t hash;
  slot_type *extraout_RDX;
  slot_type *extraout_RDX_00;
  slot_type *old_slot;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>
  *alloc;
  ulong uVar3;
  size_t i;
  size_t sVar4;
  FindInfo FVar5;
  string_view v;
  undefined1 local_5a;
  undefined1 local_59;
  HashSetResizeHelper resize_helper;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("(IsValidCapacity(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe92,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>]"
                 );
  }
  resize_helper.old_capacity_ = common->capacity_;
  resize_helper.had_infoz_ = (bool)((byte)common->size_ & 1);
  resize_helper.was_soo_ = false;
  resize_helper.had_soo_slot_ = false;
  resize_helper.old_heap_or_soo_.heap.control = (common->heap_or_soo_).heap.control;
  resize_helper.old_heap_or_soo_.heap.slot_array = (common->heap_or_soo_).heap.slot_array;
  CommonFields::set_capacity(common,new_capacity);
  bVar1 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,80ul,false,false,8ul>
                    (&resize_helper,common,&local_59,0xffffffffffffff80,0x20,0x50);
  if (resize_helper.old_capacity_ != 0) {
    alloc = *(allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>
              **)((long)&common->heap_or_soo_ + 8);
    if (bVar1) {
      if (7 < resize_helper.old_capacity_) {
        __assert_fail("(old_capacity_ < Group::kWidth / 2) && \"Try enabling sanitizers.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x856,
                      "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>]"
                     );
      }
      if ((0x10 < common->capacity_) || (common->capacity_ <= resize_helper.old_capacity_)) {
        __assert_fail("(IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity())) && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x858,
                      "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>]"
                     );
      }
      new_slot = (slot_type *)HashSetResizeHelper::old_slots(&resize_helper);
      pcVar2 = HashSetResizeHelper::old_ctrl(&resize_helper);
      old_slot = extraout_RDX;
      for (uVar3 = 0; alloc = alloc + 0x50, uVar3 < resize_helper.old_capacity_; uVar3 = uVar3 + 1)
      {
        if (kSentinel < pcVar2[uVar3]) {
          common_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,void>
          ::
          transfer<std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>>>
                    (alloc,new_slot,old_slot);
          old_slot = extraout_RDX_00;
        }
        new_slot = new_slot + 1;
      }
    }
    else {
      from = (slot_type *)HashSetResizeHelper::old_slots(&resize_helper);
      for (sVar4 = 0; sVar4 != resize_helper.old_capacity_; sVar4 = sVar4 + 1) {
        pcVar2 = HashSetResizeHelper::old_ctrl(&resize_helper);
        if (kSentinel < pcVar2[sVar4]) {
          v._M_str = (from->value).first._M_dataplus._M_p;
          v._M_len = (from->key)._M_string_length;
          hash = StringHash::operator()((StringHash *)common,v);
          FVar5 = find_first_non_full<void>(common,hash);
          SetCtrl(common,FVar5.offset,(ctrl_t)hash & ~kEmpty,0x50);
          transfer((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
                    *)common,(slot_type *)(alloc + FVar5.offset * 0x50),from);
        }
        from = from + 1;
      }
      CommonFields::infoz(common);
    }
    HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>(&resize_helper,&local_5a,0x50);
  }
  return;
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }